

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

void __thiscall
QGles2SwapChain::initSwapChainRenderTarget(QGles2SwapChain *this,QGles2SwapChainRenderTarget *rt)

{
  int iVar1;
  QGles2RenderPassDescriptor *pQVar2;
  int iVar3;
  qreal qVar4;
  
  pQVar2 = (QGles2RenderPassDescriptor *)(this->super_QRhiSwapChain).m_renderPassDesc;
  (rt->super_QRhiSwapChainRenderTarget).super_QRhiRenderTarget.m_renderPassDesc =
       (QRhiRenderPassDescriptor *)pQVar2;
  (rt->d).rp = pQVar2;
  (rt->d).pixelSize = this->pixelSize;
  qVar4 = QWindow::devicePixelRatio((this->super_QRhiSwapChain).m_window);
  (rt->d).dpr = (float)qVar4;
  iVar1 = (this->super_QRhiSwapChain).m_sampleCount;
  iVar3 = 0x40;
  if (iVar1 < 0x40) {
    iVar3 = iVar1;
  }
  if (iVar3 < 2) {
    iVar3 = 1;
  }
  (rt->d).sampleCount = iVar3;
  (rt->d).colorAttCount = 1;
  (rt->d).dsAttCount = (uint)((this->super_QRhiSwapChain).m_depthStencil != (QRhiRenderBuffer *)0x0)
  ;
  (rt->d).srgbUpdateAndBlend =
       (bool)((byte)(this->super_QRhiSwapChain).m_flags.
                    super_QFlagsStorageHelper<QRhiSwapChain::Flag,_4>.
                    super_QFlagsStorage<QRhiSwapChain::Flag>.i >> 2 & 1);
  return;
}

Assistant:

void QGles2SwapChain::initSwapChainRenderTarget(QGles2SwapChainRenderTarget *rt)
{
    rt->setRenderPassDescriptor(m_renderPassDesc); // for the public getter in QRhiRenderTarget
    rt->d.rp = QRHI_RES(QGles2RenderPassDescriptor, m_renderPassDesc);
    rt->d.pixelSize = pixelSize;
    rt->d.dpr = float(m_window->devicePixelRatio());
    rt->d.sampleCount = qBound(1, m_sampleCount, 64);
    rt->d.colorAttCount = 1;
    rt->d.dsAttCount = m_depthStencil ? 1 : 0;
    rt->d.srgbUpdateAndBlend = m_flags.testFlag(QRhiSwapChain::sRGB);
}